

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.h
# Opt level: O2

Orphan<capnp::DynamicCapability> * __thiscall
capnp::Orphanage::newOrphanCopy<capnp::DynamicCapability::Client>
          (Orphan<capnp::DynamicCapability> *__return_storage_ptr__,Orphanage *this,Client *copyFrom
          )

{
  RawBrandedSchema *pRVar1;
  BuilderArena *src;
  Own<capnp::ClientHook,_std::nullptr_t> OStack_58;
  OrphanBuilder local_48;
  
  pRVar1 = (copyFrom->schema).super_Schema.raw;
  src = this->arena;
  (**(code **)(*(long *)(copyFrom->super_Client).hook.ptr + 0x20))(&OStack_58);
  _::OrphanBuilder::copy((EVP_PKEY_CTX *)&local_48,(EVP_PKEY_CTX *)src);
  (__return_storage_ptr__->schema).super_Schema.raw = pRVar1;
  (__return_storage_ptr__->builder).segment = local_48.segment;
  (__return_storage_ptr__->builder).capTable = local_48.capTable;
  (__return_storage_ptr__->builder).location = local_48.location;
  local_48.segment = (SegmentBuilder *)0x0;
  (__return_storage_ptr__->builder).tag.content = local_48.tag.content;
  local_48.location = (word *)0x0;
  _::OrphanBuilder::~OrphanBuilder(&local_48);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&OStack_58);
  return __return_storage_ptr__;
}

Assistant:

inline Orphan<DynamicCapability> Orphanage::newOrphanCopy<DynamicCapability::Client>(
    DynamicCapability::Client copyFrom) const {
  return Orphan<DynamicCapability>(
      copyFrom.getSchema(), _::OrphanBuilder::copy(arena, capTable, copyFrom.hook->addRef()));
}